

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_SequenceComplete
                 (TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT sequenceHandle,
                 TPM2B_MAX_BUFFER *buffer,TPMI_RH_HIERARCHY hierarchy,TPM2B_DIGEST *result,
                 TPMT_TK_HASHCHECK *validation)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  undefined1 local_30e4 [8];
  TPMT_TK_HASHCHECK val;
  void *p_2;
  void *p_1;
  void *p;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT *pTStack_3070;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  undefined1 local_3060 [4];
  TPM_RC cmdResult;
  TSS_CMD_CONTEXT CmdCtx;
  TPM2B_DIGEST *result_local;
  TPM2B_MAX_BUFFER *pTStack_30;
  TPMI_RH_HIERARCHY hierarchy_local;
  TPM2B_MAX_BUFFER *buffer_local;
  TSS_SESSION *pTStack_20;
  TPMI_DH_OBJECT sequenceHandle_local;
  TSS_SESSION *session_local;
  TSS_DEVICE *tpm_local;
  
  cmdCtx._4_4_ = 0;
  pTStack_3070 = (TSS_CMD_CONTEXT *)local_3060;
  paramBuf._4_4_ = 0x1000;
  p = &cmdResult;
  local_3060 = (undefined1  [4])0x0;
  CmdCtx._12312_8_ = result;
  result_local._4_4_ = hierarchy;
  pTStack_30 = buffer;
  buffer_local._4_4_ = sequenceHandle;
  pTStack_20 = session;
  session_local = (TSS_SESSION *)tpm;
  if (buffer == (TPM2B_MAX_BUFFER *)0x0) {
    UVar1 = UINT16_Marshal(&NullSize,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
    pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  }
  else {
    UVar1 = TPM2B_MAX_BUFFER_Marshal(buffer,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
    pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  }
  val._68_8_ = (long)&result_local + 4;
  UVar1 = UINT32_Marshal((UINT32 *)((long)&result_local + 4),(BYTE **)&p,
                         (INT32 *)((long)&paramBuf + 4));
  pTStack_3070->ParamSize = (uint)UVar1 + pTStack_3070->ParamSize;
  cmdCtx._4_4_ = TSS_DispatchCmd((TSS_DEVICE *)session_local,0x13e,
                                 (TPM_HANDLE *)((long)&buffer_local + 4),1,&stack0xffffffffffffffe0,
                                 1,pTStack_3070);
  tpm_local._4_4_ = cmdCtx._4_4_;
  if (cmdCtx._4_4_ == 0) {
    TVar2 = TPM2B_DIGEST_Unmarshal
                      ((TPM2B_DIGEST *)CmdCtx._12312_8_,&pTStack_3070->RespBufPtr,
                       (INT32 *)&pTStack_3070->RespBytesLeft);
    if (TVar2 == 0) {
      if (validation == (TPMT_TK_HASHCHECK *)0x0) {
        TVar2 = TPMT_TK_HASHCHECK_Unmarshal
                          ((TPMT_TK_HASHCHECK *)local_30e4,&pTStack_3070->RespBufPtr,
                           (INT32 *)&pTStack_3070->RespBytesLeft);
        if (TVar2 != 0) {
          return 0x9a;
        }
      }
      else {
        TVar2 = TPMT_TK_HASHCHECK_Unmarshal
                          (validation,&pTStack_3070->RespBufPtr,
                           (INT32 *)&pTStack_3070->RespBytesLeft);
        if (TVar2 != 0) {
          return 0x9a;
        }
      }
      tpm_local._4_4_ = cmdCtx._4_4_;
    }
    else {
      tpm_local._4_4_ = 0x9a;
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TPM2_SequenceComplete(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          sequenceHandle,     // IN
    TPM2B_MAX_BUFFER       *buffer,             // IN
    TPMI_RH_HIERARCHY       hierarchy,          // IN [opt]
    TPM2B_DIGEST           *result,             // OUT
    TPMT_TK_HASHCHECK      *validation          // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, buffer);
    TSS_MARSHAL(TPMI_RH_HIERARCHY, &hierarchy);
    DISPATCH_CMD(SequenceComplete, &sequenceHandle, 1, &session, 1);
    TSS_UNMARSHAL(TPM2B_DIGEST, result);
    TSS_UNMARSHAL_OPT(TPMT_TK_HASHCHECK, validation);
    END_CMD();
}